

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

wchar_t slurp_central_directory(archive_read *a,archive_entry *entry,zip *zip)

{
  char cVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  wchar_t wVar5;
  int iVar6;
  int64_t iVar7;
  la_int64_t lVar8;
  int *piVar9;
  void *pvVar10;
  zip_entry *zip_entry_00;
  ulong name_length;
  ulong extra_length_00;
  char *name_00;
  ulong local_90;
  size_t tmp_length;
  char *r;
  char *name;
  uint32_t external_attributes;
  size_t comment_length;
  size_t extra_length;
  size_t filename_length;
  zip_entry *zip_entry;
  char *p;
  ssize_t bytes_avail;
  int64_t correction;
  long lStack_30;
  uint found;
  ssize_t i;
  zip *zip_local;
  archive_entry *entry_local;
  archive_read *a_local;
  
  i = (ssize_t)zip;
  zip_local = (zip *)entry;
  entry_local = (archive_entry *)a;
  iVar7 = __archive_read_seek(a,zip->central_directory_offset_adjusted,0);
  if (-1 < iVar7) {
    correction._4_4_ = 0;
    while (correction._4_4_ == 0) {
      zip_entry = (zip_entry *)__archive_read_ahead((archive_read *)entry_local,0x14,(ssize_t *)&p);
      if (zip_entry == (zip_entry *)0x0) {
        return L'\xffffffe2';
      }
      correction._4_4_ = 0;
      lStack_30 = 0;
      while (correction._4_4_ == 0 && lStack_30 < (long)(p + -4)) {
        cVar1 = *(char *)((long)(zip_entry->node).rb_nodes + lStack_30 + 3);
        if (cVar1 == '\x01') {
          lStack_30 = lStack_30 + 1;
        }
        else if (cVar1 == '\x02') {
          if (*(int *)((long)(zip_entry->node).rb_nodes + lStack_30) == 0x2014b50) {
            zip_entry = (zip_entry *)((long)(zip_entry->node).rb_nodes + lStack_30);
            correction._4_4_ = 1;
          }
          else {
            lStack_30 = lStack_30 + 4;
          }
        }
        else if (cVar1 == '\x05') {
          lStack_30 = lStack_30 + 1;
        }
        else if (cVar1 == '\x06') {
          if (*(int *)((long)(zip_entry->node).rb_nodes + lStack_30) == 0x6054b50) {
            zip_entry = (zip_entry *)((long)(zip_entry->node).rb_nodes + lStack_30);
            correction._4_4_ = 1;
          }
          else if (*(int *)((long)(zip_entry->node).rb_nodes + lStack_30) == 0x6064b50) {
            zip_entry = (zip_entry *)((long)(zip_entry->node).rb_nodes + lStack_30);
            correction._4_4_ = 1;
          }
          else {
            lStack_30 = lStack_30 + 1;
          }
        }
        else if (cVar1 == 'K') {
          lStack_30 = lStack_30 + 2;
        }
        else if (cVar1 == 'P') {
          lStack_30 = lStack_30 + 3;
        }
        else {
          lStack_30 = lStack_30 + 4;
        }
      }
      __archive_read_consume((archive_read *)entry_local,lStack_30);
    }
    lVar8 = archive_filter_bytes((archive *)entry_local,0);
    bytes_avail = lVar8 - *(long *)(i + 0x18);
    __archive_rb_tree_init((archive_rb_tree *)(i + 0x48),&rb_ops);
    __archive_rb_tree_init((archive_rb_tree *)(i + 0x58),&rb_rsrc_ops);
    *(undefined8 *)(i + 0x28) = 0;
    while (piVar9 = (int *)__archive_read_ahead((archive_read *)entry_local,4,(ssize_t *)0x0),
          piVar9 != (int *)0x0) {
      if ((*piVar9 == 0x6064b50) || (*piVar9 == 0x6054b50)) {
        return L'\0';
      }
      if (*piVar9 != 0x2014b50) {
        archive_set_error((archive *)entry_local,-1,"Invalid central directory signature");
        return L'\xffffffe2';
      }
      pvVar10 = __archive_read_ahead((archive_read *)entry_local,0x2e,(ssize_t *)0x0);
      if (pvVar10 == (void *)0x0) {
        return L'\xffffffe2';
      }
      zip_entry_00 = (zip_entry *)calloc(1,0x90);
      if (zip_entry_00 == (zip_entry *)0x0) {
        archive_set_error((archive *)entry_local,0xc,"Can\'t allocate zip entry");
        return L'\xffffffe2';
      }
      zip_entry_00->next = *(zip_entry **)(i + 0x40);
      zip_entry_00->flags = zip_entry_00->flags | 2;
      *(zip_entry **)(i + 0x40) = zip_entry_00;
      *(long *)(i + 0x28) = *(long *)(i + 0x28) + 1;
      zip_entry_00->system = *(uchar *)((long)pvVar10 + 5);
      uVar2 = archive_le16dec((void *)((long)pvVar10 + 8));
      zip_entry_00->zip_flags = uVar2;
      if ((zip_entry_00->zip_flags & 0x41) != 0) {
        *(undefined4 *)(i + 0x38) = 1;
      }
      uVar2 = archive_le16dec((void *)((long)pvVar10 + 10));
      zip_entry_00->compression = (uchar)uVar2;
      uVar3 = archive_le32dec((void *)((long)pvVar10 + 0xc));
      iVar7 = dos_to_unix(uVar3);
      zip_entry_00->mtime = iVar7;
      uVar3 = archive_le32dec((void *)((long)pvVar10 + 0x10));
      zip_entry_00->crc32 = uVar3;
      if ((zip_entry_00->zip_flags & 8) == 0) {
        zip_entry_00->decdat = *(uchar *)((long)pvVar10 + 0x13);
      }
      else {
        zip_entry_00->decdat = *(uchar *)((long)pvVar10 + 0xd);
      }
      uVar3 = archive_le32dec((void *)((long)pvVar10 + 0x14));
      zip_entry_00->compressed_size = (ulong)uVar3;
      uVar3 = archive_le32dec((void *)((long)pvVar10 + 0x18));
      zip_entry_00->uncompressed_size = (ulong)uVar3;
      uVar2 = archive_le16dec((void *)((long)pvVar10 + 0x1c));
      name_length = (ulong)uVar2;
      uVar2 = archive_le16dec((void *)((long)pvVar10 + 0x1e));
      extra_length_00 = (ulong)uVar2;
      uVar2 = archive_le16dec((void *)((long)pvVar10 + 0x20));
      uVar3 = archive_le32dec((void *)((long)pvVar10 + 0x26));
      uVar4 = archive_le32dec((void *)((long)pvVar10 + 0x2a));
      zip_entry_00->local_header_offset = (ulong)uVar4 + bytes_avail;
      if (zip_entry_00->system == '\x03') {
        zip_entry_00->mode = (uint16_t)(uVar3 >> 0x10);
      }
      else if (zip_entry_00->system == '\0') {
        if ((uVar3 & 0x10) == 0x10) {
          zip_entry_00->mode = 0x41fd;
        }
        else {
          zip_entry_00->mode = 0x81b4;
        }
        if ((uVar3 & 1) == 1) {
          zip_entry_00->mode = zip_entry_00->mode & 0x16d;
        }
      }
      else {
        zip_entry_00->mode = 0;
      }
      __archive_read_consume((archive_read *)entry_local,0x2e);
      name_00 = (char *)__archive_read_ahead
                                  ((archive_read *)entry_local,name_length + extra_length_00,
                                   (ssize_t *)0x0);
      if (name_00 == (char *)0x0) {
        archive_set_error((archive *)entry_local,0x54,"Truncated ZIP file header");
        return L'\xffffffe2';
      }
      wVar5 = process_extra((archive_read *)entry_local,(archive_entry *)zip_local,
                            name_00 + name_length,extra_length_00,zip_entry_00);
      if (wVar5 != L'\0') {
        return L'\xffffffe2';
      }
      if (*(int *)(i + 0x1eec) == 0) {
        __archive_rb_tree_insert_node((archive_rb_tree *)(i + 0x48),(archive_rb_node *)zip_entry_00)
        ;
      }
      else {
        tmp_length = (size_t)rsrc_basename(name_00,name_length);
        if ((name_length < 9) || (iVar6 = strncmp("__MACOSX/",name_00,9), iVar6 != 0)) {
          local_90 = name_length;
          if ((name_length != 0) && (name_00[name_length - 1] == '/')) {
            local_90 = name_length - 1;
            tmp_length = (size_t)rsrc_basename(name_00,local_90);
          }
          (zip_entry_00->rsrcname).length = 0;
          archive_strncat(&zip_entry_00->rsrcname,"__MACOSX/",9);
          archive_strncat(&zip_entry_00->rsrcname,name_00,tmp_length - (long)name_00);
          archive_strcat(&zip_entry_00->rsrcname,"._");
          archive_strncat(&zip_entry_00->rsrcname,(void *)tmp_length,
                          local_90 - (tmp_length - (long)name_00));
          __archive_rb_tree_insert_node
                    ((archive_rb_tree *)(i + 0x48),(archive_rb_node *)zip_entry_00);
        }
        else if ((name_00[name_length - 1] == '/') ||
                (((2 < (long)(tmp_length - (long)name_00) && (*(char *)tmp_length == '.')) &&
                 (*(char *)(tmp_length + 1) == '_')))) {
          (zip_entry_00->rsrcname).length = 0;
          archive_strncat(&zip_entry_00->rsrcname,name_00,name_length);
          __archive_rb_tree_insert_node
                    ((archive_rb_tree *)(i + 0x58),(archive_rb_node *)zip_entry_00);
        }
        else {
          __archive_rb_tree_insert_node
                    ((archive_rb_tree *)(i + 0x48),(archive_rb_node *)zip_entry_00);
          expose_parent_dirs((zip *)i,name_00,name_length);
        }
      }
      __archive_read_consume
                ((archive_read *)entry_local,name_length + extra_length_00 + (ulong)uVar2);
    }
  }
  return L'\xffffffe2';
}

Assistant:

static int
slurp_central_directory(struct archive_read *a, struct _7zip *zip,
    struct _7z_header_info *header)
{
	const unsigned char *p;
	uint64_t next_header_offset;
	uint64_t next_header_size;
	uint32_t next_header_crc;
	ssize_t bytes_avail;
	int check_header_crc, r;

	if ((p = __archive_read_ahead(a, 32, &bytes_avail)) == NULL)
		return (ARCHIVE_FATAL);

	if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0) {
		/* This is an executable ? Must be self-extracting... */
		r = skip_sfx(a, bytes_avail);
		if (r < ARCHIVE_WARN)
			return (r);
		if ((p = __archive_read_ahead(a, 32, &bytes_avail)) == NULL)
			return (ARCHIVE_FATAL);
	}
	zip->seek_base += 32;

	if (memcmp(p, _7ZIP_SIGNATURE, 6) != 0) {
		archive_set_error(&a->archive, -1, "Not 7-Zip archive file");
		return (ARCHIVE_FATAL);
	}

	/* CRC check. */
	if (crc32(0, (const unsigned char *)p + 12, 20)
	    != archive_le32dec(p + 8)) {
#ifndef DONT_FAIL_ON_CRC_ERROR
		archive_set_error(&a->archive, -1, "Header CRC error");
		return (ARCHIVE_FATAL);
#endif
	}

	next_header_offset = archive_le64dec(p + 12);
	next_header_size = archive_le64dec(p + 20);
	next_header_crc = archive_le32dec(p + 28);

	if (next_header_size == 0)
		/* There is no entry in an archive file. */
		return (ARCHIVE_EOF);

	if (((int64_t)next_header_offset) < 0) {
		archive_set_error(&a->archive, -1, "Malformed 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	__archive_read_consume(a, 32);
	if (next_header_offset != 0) {
		if (bytes_avail >= (ssize_t)next_header_offset)
			__archive_read_consume(a, next_header_offset);
		else if (__archive_read_seek(a,
		    next_header_offset + zip->seek_base, SEEK_SET) < 0)
			return (ARCHIVE_FATAL);
	}
	zip->stream_offset = next_header_offset;
	zip->header_offset = next_header_offset;
	zip->header_bytes_remaining = next_header_size;
	zip->header_crc32 = 0;
	zip->header_is_encoded = 0;
	zip->header_is_being_read = 1;
	zip->has_encrypted_entries = 0;
	check_header_crc = 1;

	if ((p = header_bytes(a, 1)) == NULL) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated 7-Zip file body");
		return (ARCHIVE_FATAL);
	}
	/* Parse ArchiveProperties. */
	switch (p[0]) {
	case kEncodedHeader:
		/*
		 * The archive has an encoded header and we have to decode it
		 * in order to parse the header correctly.
		 */
		r = decode_encoded_header_info(a, &(zip->si));

		/* Check the EncodedHeader CRC.*/
		if (r == 0 && zip->header_crc32 != next_header_crc) {
#ifndef DONT_FAIL_ON_CRC_ERROR
			archive_set_error(&a->archive, -1,
			    "Damaged 7-Zip archive");
			r = -1;
#endif
		}
		if (r == 0) {
			if (zip->si.ci.folders[0].digest_defined)
				next_header_crc = zip->si.ci.folders[0].digest;
			else
				check_header_crc = 0;
			if (zip->pack_stream_bytes_unconsumed)
				read_consume(a);
			r = setup_decode_folder(a, zip->si.ci.folders, 1);
			if (r == 0) {
				zip->header_bytes_remaining =
					zip->folder_outbytes_remaining;
				r = seek_pack(a);
			}
		}
		/* Clean up StreamsInfo. */
		free_StreamsInfo(&(zip->si));
		memset(&(zip->si), 0, sizeof(zip->si));
		if (r < 0)
			return (ARCHIVE_FATAL);
		zip->header_is_encoded = 1;
		zip->header_crc32 = 0;
		/* FALL THROUGH */
	case kHeader:
		/*
		 * Parse the header.
		 */
		errno = 0;
		r = read_Header(a, header, zip->header_is_encoded);
		if (r < 0) {
			if (errno == ENOMEM)
				archive_set_error(&a->archive, -1,
				    "Couldn't allocate memory");
			else
				archive_set_error(&a->archive, -1,
				    "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}

		/*
		 *  Must be kEnd.
		 */
		if ((p = header_bytes(a, 1)) == NULL ||*p != kEnd) {
			archive_set_error(&a->archive, -1,
			    "Malformed 7-Zip archive");
			return (ARCHIVE_FATAL);
		}

		/* Check the Header CRC.*/
		if (check_header_crc && zip->header_crc32 != next_header_crc) {
#ifndef DONT_FAIL_ON_CRC_ERROR
			archive_set_error(&a->archive, -1,
			    "Malformed 7-Zip archive");
			return (ARCHIVE_FATAL);
#endif
		}
		break;
	default:
		archive_set_error(&a->archive, -1,
		    "Unexpected Property ID = %X", p[0]);
		return (ARCHIVE_FATAL);
	}

	/* Clean up variables be used for decoding the archive header */
	zip->pack_stream_remaining = 0;
	zip->pack_stream_index = 0;
	zip->folder_outbytes_remaining = 0;
	zip->uncompressed_buffer_bytes_remaining = 0;
	zip->pack_stream_bytes_unconsumed = 0;
	zip->header_is_being_read = 0;

	return (ARCHIVE_OK);
}